

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O0

void __thiscall bgui::anon_unknown_0::X11Exception::X11Exception(X11Exception *this,string *message)

{
  Exception *in_RSI;
  undefined8 *in_RDI;
  allocator local_31;
  string local_30 [16];
  string *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"X11",&local_31);
  gutil::Exception::Exception(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *in_RDI = &PTR__X11Exception_001c52f8;
  return;
}

Assistant:

X11Exception(const std::string &message) :
      gutil::Exception("X11", message) { }